

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O1

void parse_direct_declarator_finish
               (Translation_Data *translation_data,Scope *scope,Denoted_Base *base)

{
  char cVar1;
  Normal_Scope *function_prototype_scope;
  Queue *q;
  AST *ast;
  Type *pTVar2;
  
  do {
    while( true ) {
      cVar1 = get_and_check(translation_data,KW_OPEN_SQUARE);
      if (cVar1 != '\0') break;
      cVar1 = get_and_check(translation_data,KW_OPEN_NORMAL);
      if (cVar1 == '\0') {
        return;
      }
      function_prototype_scope = (Normal_Scope *)get_normal_scope(scope,FUNCTION_PROTOTYPE_SCOPE);
      q = (Queue *)malloc(0x18);
      Queue_Init(q);
      parse_paramenter_list(translation_data,function_prototype_scope,q);
      pTVar2 = get_function_type(base->type,q,function_prototype_scope);
      base->type = pTVar2;
    }
    cVar1 = get_and_check(translation_data,KW_CLOSE_SQUARE);
    if (cVar1 == '\0') {
      ast = parse_expression(translation_data,scope);
      cVar1 = get_and_check(translation_data,KW_CLOSE_SQUARE);
      if (cVar1 == '\0') {
        push_translation_error("\']\' expected",translation_data);
        pTVar2 = get_type_error(base->type);
        base->type = pTVar2;
        delete_ast(ast);
        return;
      }
    }
    else {
      ast = (AST *)0x0;
    }
    parse_direct_declarator_finish(translation_data,scope,base);
    pTVar2 = get_array_type(base->type,ast,translation_data);
    base->type = pTVar2;
  } while( true );
}

Assistant:

void parse_direct_declarator_finish(struct Translation_Data *translation_data,struct Scope *scope,struct Denoted_Base *base)
{
	struct AST *hold_expression;
	while(1)
	{
		if(get_and_check(translation_data,KW_OPEN_SQUARE))
		{
			if(get_and_check(translation_data,KW_CLOSE_SQUARE))
			{
				hold_expression=NULL;
			}else
			{
				hold_expression=parse_expression(translation_data,scope);
				if(!get_and_check(translation_data,KW_CLOSE_SQUARE))
				{
					/*TODO error*/
					push_translation_error("']' expected",translation_data);
					base->type=(struct Type*)get_type_error(base->type);
					delete_ast(hold_expression);
					return;
				}
			}

			parse_direct_declarator_finish(translation_data,scope,base);
			base->type=get_array_type(base->type,hold_expression,translation_data);

		}else if(get_and_check(translation_data,KW_OPEN_NORMAL))
		{
			struct Queue *parameters;
			struct Normal_Scope *function_prototype_scope;

			function_prototype_scope=(struct Normal_Scope*)get_normal_scope(scope,FUNCTION_PROTOTYPE_SCOPE);

			parameters=malloc(sizeof(struct Queue));
			Queue_Init(parameters);

			parse_paramenter_list(translation_data,function_prototype_scope,parameters);
			base->type=(struct Type*)get_function_type(base->type,parameters,function_prototype_scope);
			
		}else
		{
			break;
		}
		
	}

}